

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserTest::ExpectHasEarlyExitErrors
          (ParserTest *this,string_view text,
          Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *expected_errors)

{
  bool bVar1;
  pointer pPVar2;
  pointer input;
  char *pcVar3;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *matcher
  ;
  char *in_R9;
  AssertHelper local_218;
  Message local_210;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  PredicateFormatterFromMatcher<testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1a8;
  Message local_1a0;
  bool local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_;
  FileDescriptorProto file;
  undefined1 local_78 [8];
  SourceLocationTable source_locations;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *expected_errors_local;
  ParserTest *this_local;
  string_view text_local;
  
  source_locations.import_location_map_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)text._M_len;
  SetupParser(this,text);
  SourceLocationTable::SourceLocationTable((SourceLocationTable *)local_78);
  pPVar2 = std::
           unique_ptr<google::protobuf::compiler::Parser,_std::default_delete<google::protobuf::compiler::Parser>_>
           ::operator->(&this->parser_);
  Parser::RecordSourceLocationsTo(pPVar2,(SourceLocationTable *)local_78);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar_.message_);
  pPVar2 = std::
           unique_ptr<google::protobuf::compiler::Parser,_std::default_delete<google::protobuf::compiler::Parser>_>
           ::operator->(&this->parser_);
  input = std::
          unique_ptr<google::protobuf::io::Tokenizer,_std::default_delete<google::protobuf::io::Tokenizer>_>
          ::get(&this->input_);
  bVar1 = Parser::Parse(pPVar2,input,(FileDescriptorProto *)&gtest_ar_.message_);
  local_191 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_190,&local_191,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_190,
               (AssertionResult *)"parser_->Parse(input_.get(), &file)","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0xa2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_208,expected_errors);
  testing::internal::MakePredicateFormatterFromMatcher<testing::Matcher<std::__cxx11::string>>
            (&local_1f0,(internal *)&local_208,matcher);
  testing::internal::PredicateFormatterFromMatcher<testing::Matcher<std::__cxx11::string>>::
  operator()(local_1d8,(char *)&local_1f0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             "error_collector_.text_");
  testing::internal::
  PredicateFormatterFromMatcher<testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_1f0);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_208);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_210);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0xa3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_218,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar_.message_);
  SourceLocationTable::~SourceLocationTable((SourceLocationTable *)local_78);
  return;
}

Assistant:

void ExpectHasEarlyExitErrors(
      absl::string_view text,
      const testing::Matcher<std::string>& expected_errors) {
    SetupParser(text);
    SourceLocationTable source_locations;
    parser_->RecordSourceLocationsTo(&source_locations);
    FileDescriptorProto file;
    EXPECT_FALSE(parser_->Parse(input_.get(), &file));
    EXPECT_THAT(error_collector_.text_, expected_errors);
  }